

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdcpp.hpp
# Opt level: O3

unique_ptr<so_5::disp::reuse::binder_for_public_disp_template_t<so_5::disp::active_group::impl::proxy_dispatcher_t,_so_5::disp::active_group::impl::binding_actions_t>,_std::default_delete<so_5::disp::reuse::binder_for_public_disp_template_t<so_5::disp::active_group::impl::proxy_dispatcher_t,_so_5::disp::active_group::impl::binding_actions_t>_>_>
 __thiscall
so_5::stdcpp::
make_unique<so_5::disp::reuse::binder_for_public_disp_template_t<so_5::disp::active_group::impl::proxy_dispatcher_t,so_5::disp::active_group::impl::binding_actions_t>,std::__cxx11::string_const&,std::__cxx11::string_const&>
          (stdcpp *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  pointer pcVar1;
  binder_for_public_disp_template_t<so_5::disp::active_group::impl::proxy_dispatcher_t,so_5::disp::active_group::impl::binding_actions_t>
  *this_00;
  string local_48;
  
  this_00 = (binder_for_public_disp_template_t<so_5::disp::active_group::impl::proxy_dispatcher_t,so_5::disp::active_group::impl::binding_actions_t>
             *)operator_new(0x48);
  pcVar1 = (args->_M_dataplus)._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + args->_M_string_length);
  disp::reuse::
  binder_for_public_disp_template_t<so_5::disp::active_group::impl::proxy_dispatcher_t,so_5::disp::active_group::impl::binding_actions_t>
  ::binder_for_public_disp_template_t<std::__cxx11::string_const&>(this_00,&local_48,args_1);
  *(binder_for_public_disp_template_t<so_5::disp::active_group::impl::proxy_dispatcher_t,so_5::disp::active_group::impl::binding_actions_t>
    **)this = this_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return (__uniq_ptr_data<so_5::disp::reuse::binder_for_public_disp_template_t<so_5::disp::active_group::impl::proxy_dispatcher_t,_so_5::disp::active_group::impl::binding_actions_t>,_std::default_delete<so_5::disp::reuse::binder_for_public_disp_template_t<so_5::disp::active_group::impl::proxy_dispatcher_t,_so_5::disp::active_group::impl::binding_actions_t>_>,_true,_true>
          )(__uniq_ptr_data<so_5::disp::reuse::binder_for_public_disp_template_t<so_5::disp::active_group::impl::proxy_dispatcher_t,_so_5::disp::active_group::impl::binding_actions_t>,_std::default_delete<so_5::disp::reuse::binder_for_public_disp_template_t<so_5::disp::active_group::impl::proxy_dispatcher_t,_so_5::disp::active_group::impl::binding_actions_t>_>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr< T >
make_unique( ARGS && ...args )
	{
		return std::unique_ptr< T >( new T( std::forward<ARGS>(args)... ) );
	}